

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManCutMatchPrint(Nf_Man_t *p,int iObj,char *pStr,Nf_Mat_t *pM)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  undefined8 *puVar11;
  
  printf("%5d %s : ");
  uVar5 = *(uint *)pM;
  if ((uVar5 & 0x3ff00000) == 0) {
    puts("Unassigned");
    return;
  }
  if ((iObj < 0) || ((p->vCutSets).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar4 = (p->vCutSets).pArray[(uint)iObj];
  uVar2 = (int)uVar4 >> 0x10;
  if (((int)uVar2 < 0) || ((p->vPages).nSize <= (int)uVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar3 = uVar5 >> 0x14 & 0x3ff;
  if (uVar3 == 0) {
    __assert_fail("h > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x94,"int *Nf_CutFromHandle(int *, int)");
  }
  puVar11 = (undefined8 *)((long)p->pCells->iDelays + ((ulong)((uVar5 & 0xfffff) * 0x50) - 0x2c));
  pvVar1 = (p->vPages).pArray[uVar2];
  printf("D =%6.2f  ",(double)((float)pM->D / 1000.0));
  printf("A =%6.2f  ",(double)pM->F);
  uVar10 = 0;
  printf("C = %d ",(ulong)(*(uint *)pM >> 0x1e & 1));
  printf("  ");
  printf("Cut = {");
  if (*(uint *)(puVar11 + 2) < 0x10000000) {
LAB_00787084:
    iVar9 = (int)uVar10 + -6;
    do {
      printf("     ");
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
  }
  else {
    uVar10 = 0;
    do {
      uVar8 = uVar10;
      printf("%4d ",(ulong)*(uint *)((long)pvVar1 +
                                    uVar8 * 4 + (ulong)uVar3 * 4 + (ulong)(uVar4 & 0xffff) * 4 + 4))
      ;
      uVar10 = uVar8 + 1;
    } while (uVar10 < *(uint *)(puVar11 + 2) >> 0x1c);
    if (uVar8 < 5) goto LAB_00787084;
  }
  uVar10 = 0;
  printf("}  ");
  printf("%10s ",*puVar11);
  printf("%d  ",(ulong)(*(uint *)(puVar11 + 2) >> 0x1c));
  putchar(0x7b);
  if (*(uint *)(puVar11 + 2) < 0x10000000) {
LAB_0078712d:
    iVar9 = (int)uVar10 + -6;
    do {
      printf("       ");
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
  }
  else {
    uVar10 = 0;
    do {
      uVar8 = uVar10;
      printf("%6.2f ",(double)((float)*(int *)((long)puVar11 + uVar8 * 4 + 0x2c) / 1000.0));
      uVar10 = uVar8 + 1;
    } while (uVar10 < *(uint *)(puVar11 + 2) >> 0x1c);
    if (uVar8 < 5) goto LAB_0078712d;
  }
  iVar9 = 0;
  printf(" } ");
  if (0xfffffff < *(uint *)(puVar11 + 2)) {
    bVar7 = 0;
    uVar5 = 0xffffffff;
    do {
      uVar4 = uVar5;
      uVar5 = uVar4 + 1;
      pcVar6 = "!";
      if ((1 << ((byte)uVar5 & 0x1f) & (uint)pM->Cfg >> 1 & 0x7f) == 0) {
        pcVar6 = " ";
      }
      printf("%s%d ",pcVar6,(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf));
      uVar2 = *(uint *)(puVar11 + 2);
      bVar7 = bVar7 + 4;
    } while (uVar4 + 2 < uVar2 >> 0x1c);
    if (4 < uVar5) goto LAB_007871f1;
    iVar9 = uVar4 + 2;
  }
  iVar9 = iVar9 + -6;
  do {
    printf("  ");
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0);
  uVar2 = *(uint *)(puVar11 + 2);
LAB_007871f1:
  Dau_DsdPrintFromTruth(puVar11 + 4,uVar2 >> 0x1c);
  return;
}

Assistant:

void Nf_ManCutMatchPrint( Nf_Man_t * p, int iObj, char * pStr, Nf_Mat_t * pM )
{
    Mio_Cell2_t * pCell;
    int i, * pCut;
    printf( "%5d %s : ", iObj, pStr );
    if ( pM->CutH == 0 )
    {
        printf( "Unassigned\n" );
        return;
    }
    pCell = Nf_ManCell( p, pM->Gate );
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    printf( "D =%6.2f  ", Scl_Int2Flt(pM->D) );
    printf( "A =%6.2f  ", pM->F );
    printf( "C = %d ", pM->fCompl );
//    printf( "B = %d ", pM->fBest );
    printf( "  " );
    printf( "Cut = {" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%4d ", Nf_CutLeaves(pCut)[i] );
    for ( ; i < 6; i++ )
        printf( "     " );
    printf( "}  " );
    printf( "%10s ", pCell->pName );
    printf( "%d  ", pCell->nFanins );
    printf( "{" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%6.2f ", Scl_Int2Flt(pCell->iDelays[i]) );
    for ( ; i < 6; i++ )
        printf( "       " );
    printf( " } " );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%s%d ", Nf_CfgCompl(pM->Cfg, i) ? "!":" ", Nf_CfgVar(pM->Cfg, i) );
    for ( ; i < 6; i++ )
        printf( "  " );
    Dau_DsdPrintFromTruth( &pCell->uTruth, pCell->nFanins );
}